

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O1

size_t HUF_decompress1X_usingDTable
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable)

{
  undefined1 *puVar1;
  uint uVar2;
  ulong uVar3;
  size_t sVar4;
  byte bVar5;
  ulong uVar6;
  int in_R9D;
  uint uVar7;
  int iVar8;
  ulong *puVar9;
  ulong uVar10;
  ulong *puVar11;
  bool bVar12;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar4 = HUF_decompress1X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,in_R9D);
    return sVar4;
  }
  if (cSrcSize == 0) {
    cSrcSize = 0xffffffffffffffb8;
    uVar3 = 0;
    uVar6 = 0;
    puVar11 = (ulong *)0x0;
    cSrc = (ulong *)0x0;
    puVar9 = (ulong *)0x0;
  }
  else {
    puVar9 = (ulong *)((long)cSrc + 8);
    if (cSrcSize < 8) {
      uVar6 = (ulong)*cSrc;
      switch(cSrcSize) {
      case 7:
        uVar6 = uVar6 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
      case 6:
        uVar6 = uVar6 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
      case 5:
        uVar6 = uVar6 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
      case 4:
        uVar6 = uVar6 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
      case 3:
        uVar6 = uVar6 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
      case 2:
        uVar6 = uVar6 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
      default:
        bVar5 = *(byte *)((long)cSrc + (cSrcSize - 1));
        uVar2 = 0x1f;
        if (bVar5 != 0) {
          for (; bVar5 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        if (bVar5 == 0) {
          cSrcSize = 0xffffffffffffffec;
          uVar2 = 0;
        }
        else {
          uVar2 = ~uVar2 + (int)cSrcSize * -8 + 0x49;
        }
        uVar3 = (ulong)uVar2;
        puVar11 = (ulong *)cSrc;
      }
    }
    else {
      puVar11 = (ulong *)((long)cSrc + (cSrcSize - 8));
      uVar6 = *puVar11;
      bVar5 = *(byte *)((long)cSrc + (cSrcSize - 1));
      uVar2 = 0x1f;
      if (bVar5 != 0) {
        for (; bVar5 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar2 = ~uVar2 + 9;
      if (bVar5 == 0) {
        uVar2 = 0;
      }
      uVar3 = (ulong)uVar2;
      cSrcSize = cSrcSize | -(ulong)(bVar5 == 0);
    }
  }
  if (0xffffffffffffff88 < cSrcSize) {
    return cSrcSize;
  }
  puVar1 = (undefined1 *)((long)dst + maxDstSize);
  bVar5 = -(char)*(undefined2 *)((long)DTable + 2) & 0x3f;
  do {
    uVar2 = (uint)uVar3;
    if (uVar2 < 0x41) {
      if (puVar11 < puVar9) {
        if (puVar11 == (ulong *)cSrc) goto LAB_00434a28;
        bVar12 = cSrc <= (ulong *)((long)puVar11 - (uVar3 >> 3));
        uVar7 = (int)puVar11 - (int)cSrc;
        if (bVar12) {
          uVar7 = (uint)(uVar3 >> 3);
        }
        uVar2 = uVar2 + uVar7 * -8;
      }
      else {
        uVar7 = (uint)(uVar3 >> 3);
        uVar2 = uVar2 & 7;
        bVar12 = true;
      }
      uVar3 = (ulong)uVar2;
      puVar11 = (ulong *)((long)puVar11 - (ulong)uVar7);
      uVar6 = *puVar11;
    }
    else {
LAB_00434a28:
      bVar12 = false;
    }
    if ((puVar1 + -3 <= dst) || (!bVar12)) {
      for (; dst < puVar1; dst = (void *)((long)dst + 1)) {
        uVar10 = (uVar6 << ((byte)uVar3 & 0x3f)) >> bVar5;
        uVar3 = (ulong)((int)uVar3 + (uint)*(byte *)((long)DTable + uVar10 * 2 + 5));
        *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar10 * 2 + 4);
      }
      if ((int)uVar3 != 0x40) {
        maxDstSize = 0xffffffffffffffec;
      }
      if (puVar11 == (ulong *)cSrc) {
        return maxDstSize;
      }
      return 0xffffffffffffffec;
    }
    uVar10 = (uVar6 << ((byte)uVar3 & 0x3f)) >> bVar5;
    iVar8 = (uint)*(byte *)((long)DTable + uVar10 * 2 + 5) + (int)uVar3;
    uVar3 = (uVar6 << ((byte)iVar8 & 0x3f)) >> bVar5;
    *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar10 * 2 + 4);
    iVar8 = (uint)*(byte *)((long)DTable + uVar3 * 2 + 5) + iVar8;
    uVar10 = (uVar6 << ((byte)iVar8 & 0x3f)) >> bVar5;
    *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar3 * 2 + 4);
    iVar8 = (uint)*(byte *)((long)DTable + uVar10 * 2 + 5) + iVar8;
    *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar10 * 2 + 4);
    uVar10 = (uVar6 << ((byte)iVar8 & 0x3f)) >> bVar5;
    uVar3 = (ulong)((uint)*(byte *)((long)DTable + uVar10 * 2 + 5) + iVar8);
    *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar10 * 2 + 4);
    dst = (void *)((long)dst + 4);
  } while( true );
}

Assistant:

size_t HUF_decompress1X_usingDTable(void* dst, size_t maxDstSize,
                                    const void* cSrc, size_t cSrcSize,
                                    const HUF_DTable* DTable)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0);
#else
    return dtd.tableType ? HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0) :
                           HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0);
#endif
}